

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

double cert::cos(double __x)

{
  float fVar1;
  undefined1 local_21;
  undefined4 local_20;
  int iStack_1c;
  bool done;
  float t;
  int s;
  int i;
  float n;
  float sum;
  float x_local;
  
  fVar1 = SUB84(__x,0);
  i = 0x3f800000;
  s = 0x40000000;
  t = 4.2039e-45;
  iStack_1c = -1;
  local_20 = fVar1 * fVar1;
  local_21 = detail::feq(1.0,(local_20 * -1.0) / 2.0 + 1.0);
  while (((local_21 ^ 0xffU) & 1) != 0) {
    i = (int)((local_20 * (float)iStack_1c) / (float)s + (float)i);
    s = (int)((float)((int)t * ((int)t + 1)) * (float)s);
    t = (float)((int)t + 2);
    iStack_1c = -iStack_1c;
    local_20 = fVar1 * fVar1 * local_20;
    local_21 = detail::feq((float)i,(float)i + (local_20 * (float)iStack_1c) / (float)s);
  }
  return (double)(ulong)(uint)i;
}

Assistant:

constexpr float cos (float x)
{
	float sum = 1.0f;
	float n = 2.0f;
	int i = 3;
	int s = -1;
	float t = x * x;

	bool done = detail::feq (sum, sum + t * s / n);
	while (!done)
	{
		sum += t * s / n;
		n *= i * (i + 1);
		i += 2;
		s = -s;
		t *= x * x;
		done = detail::feq (sum, sum + t * s / n);
	}
	return sum;
	// return trig_series (x, 1.0f, 2.0f, 3, -1, x * x);
}